

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O3

bool FIX::TimeRange::isInRange
               (DateTime *startTime,DateTime *endTime,int startDay,int endDay,DateTime *time)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  int D;
  int M;
  int Y;
  int local_3c;
  int local_38;
  int local_34;
  
  DateTime::getYMD(time->m_date,&local_34,&local_38,&local_3c);
  iVar2 = local_38 + 10;
  if (2 < local_38) {
    iVar2 = local_38 + -2;
  }
  local_34 = local_34 - (uint)(local_38 < 3);
  iVar3 = (int)((ulong)((long)local_34 * -0x51eb851f) >> 0x20);
  cVar4 = (char)(local_34 % 100);
  iVar2 = local_34 % 100 + local_3c + local_34 / 400 + ((iVar3 >> 5) - (iVar3 >> 0x1f)) * 2 +
          (int)((char)(((byte)(cVar4 >> 7) >> 6) + cVar4) >> 2) + (int)((double)iVar2 * 2.6 + -0.2);
  iVar3 = iVar2 % 7;
  iVar2 = iVar2 % 7 + 7;
  if (-1 < iVar3) {
    iVar2 = iVar3;
  }
  bVar1 = isInRange(startTime,endTime,startDay,endDay,time,iVar2 + 1);
  return bVar1;
}

Assistant:

bool TimeRange::isInRange( const DateTime& startTime,
                             const DateTime& endTime,
                             int startDay,
                             int endDay,
               const DateTime& time ) 
  {
    return isInRange( startTime, endTime, startDay, endDay, time, time.getWeekDay() );
  }